

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
* __thiscall
google::protobuf::internal::TailCallTableInfo::BuildFieldEntries
          (vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           *__return_storage_ptr__,TailCallTableInfo *this,Descriptor *descriptor,
          MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields,
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          *aux_entries)

{
  uint8_t uVar1;
  uint32_t uVar2;
  pointer pFVar3;
  pointer pAVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *pvVar8;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *pvVar9;
  bool bVar10;
  Utf8CheckMode UVar11;
  byte bVar12;
  bool bVar13;
  CppStringType CVar14;
  undefined4 uVar15;
  OneofDescriptor *pOVar16;
  Descriptor *pDVar17;
  FieldDescriptor *pFVar18;
  EnumDescriptor *pEVar19;
  Nullable<const_char_*> failure_msg;
  TransformValidation TVar20;
  long lVar21;
  FieldOptions *options;
  FieldOptions *options_00;
  pointer __n;
  TransformValidation TVar22;
  int32_t first;
  uint uStack_84;
  anon_union_8_4_4b2d21c6_for_AuxEntry_1 local_80;
  undefined4 uStack_78;
  Utf8CheckMode local_74;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *local_70;
  long local_68;
  unsigned_long local_60;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *local_58;
  Descriptor *local_50;
  long local_48;
  long local_40;
  int32_t last;
  
  local_70 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              *)ordered_fields.len_;
  __n = ordered_fields.ptr_;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = __return_storage_ptr__;
  local_50 = descriptor;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::reserve(__return_storage_ptr__,(size_type)__n);
  local_60 = 0;
  options_00 = (FieldOptions *)message_options;
  for (lVar21 = (long)__n << 5; lVar21 != 0; lVar21 = lVar21 + -0x20) {
    pFVar18 = options_00->field;
    if ((((((pFVar18->type_ & 0xfe) == 10) && (bVar10 = FieldDescriptor::is_map(pFVar18), !bVar10))
         && ((pFVar18->options_->field_0)._impl_.weak_ == false)) &&
        ((bVar10 = anon_unknown_36::HasLazyRep(pFVar18,options_00), !bVar10 &&
         (options_00->is_implicitly_weak == false)))) &&
       (options_00->use_direct_tcparser_table == true)) {
      local_60 = (local_60 + 1) - (ulong)(options_00->presence_probability < 0.005);
    }
    options_00 = options_00 + 1;
  }
  lVar21 = (long)(local_70->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_70->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ::resize(local_70,lVar21 + local_60);
  local_40 = (long)__n << 5;
  local_68 = lVar21;
  local_48 = lVar21;
LAB_0036575b:
  pvVar9 = local_58;
  if (local_40 == 0) {
    _first = (FieldDescriptor *)(local_68 - local_48);
    _last = local_60;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                            ((unsigned_long *)&first,(unsigned_long *)&last,
                             "subtable_aux_idx - subtable_aux_idx_begin == num_non_cold_subtables");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      return local_58;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&first,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x38e,failure_msg);
LAB_00365f7a:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&first);
  }
  pFVar18 = ((FieldOptions *)message_options)->field;
  local_80.offset = ((FieldOptions *)message_options)->has_bit_index;
  local_74 = kStrict;
  local_80.enum_range.last = 0;
  uStack_78._0_2_ = 0;
  uStack_78._2_2_ = 0;
  _first = pFVar18;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::emplace_back<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>
            (local_58,(FieldEntryInfo *)&first);
  pFVar3 = (pvVar9->
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  UVar11 = cpp::GetUtf8CheckMode(pFVar18,(bool)(local_50->super_SymbolBase).symbol_type_);
  pFVar3[-1].utf8_check_mode = UVar11;
  TVar22 = 0x10;
  if (pFVar3[-1].hasbit_idx < 0) {
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar22 = 0x20;
    if (!bVar10) {
      pOVar16 = FieldDescriptor::real_containing_oneof(pFVar18);
      TVar22 = 0x30;
      if (pOVar16 == (OneofDescriptor *)0x0) {
        TVar22 = 0;
      }
    }
  }
  uVar1 = pFVar18->type_;
  switch(uVar1) {
  case '\x01':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x18c3;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x18c3;
    }
    break;
  case '\x02':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x1883;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x1883;
    }
    break;
  case '\x03':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x10c1;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x10c1;
    }
    break;
  case '\x04':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x8c1;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x8c1;
    }
    break;
  case '\x05':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x1081;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x1081;
    }
    break;
  case '\x06':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x8c3;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x8c3;
    }
    break;
  case '\a':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x883;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x883;
    }
    break;
  case '\b':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 1;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 1;
    }
    break;
  case '\t':
    if (UVar11 == kNone) goto switchD_00365807_caseD_c;
    if (UVar11 == kVerify) {
      TVar22 = TVar22 | 0xa05;
    }
    else if (UVar11 == kStrict) {
      TVar22 = TVar22 | 0xc05;
    }
    goto LAB_00365aa9;
  case '\n':
    if (((FieldOptions *)message_options)->is_implicitly_weak == true) {
      TVar22 = TVar22 | 0x646;
    }
    else if (((FieldOptions *)message_options)->use_direct_tcparser_table == true) {
      TVar22 = TVar22 | 0x446;
    }
    else {
      TVar22 = TVar22 | 0x246;
    }
    goto LAB_00365a9a;
  case '\v':
    bVar10 = FieldDescriptor::is_map(pFVar18);
    if (bVar10) {
      TVar22 = TVar22 | 7;
      goto LAB_00365a9a;
    }
    bVar10 = anon_unknown_36::HasLazyRep(pFVar18,(FieldOptions *)message_options);
    if (bVar10) {
      TVar20 = ((FieldOptions *)message_options)->lazy_opt;
      if ((TVar20 != kTvDefault) && (TVar20 != kTvEnum)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&first,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x292,
                   "options.lazy_opt == field_layout::kTvEager || options.lazy_opt == field_layout::kTvLazy"
                  );
        goto LAB_00365f7a;
      }
      TVar22 = TVar22 | TVar20 | 0x86;
    }
    else if (((FieldOptions *)message_options)->is_implicitly_weak == true) {
      TVar22 = TVar22 | 0x606;
    }
    else if (((FieldOptions *)message_options)->use_direct_tcparser_table == true) {
      TVar22 = TVar22 | 0x406;
    }
    else {
      TVar22 = TVar22 | 0x206;
    }
    goto LAB_00365a9a;
  case '\f':
switchD_00365807_caseD_c:
    TVar22 = TVar22 | 0x805;
    goto LAB_00365aa9;
  case '\r':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x881;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x881;
    }
    break;
  case '\x0e':
    bVar10 = anon_unknown_36::TreatEnumAsInt(pFVar18);
    if (bVar10) {
      bVar10 = FieldDescriptor::is_repeated(pFVar18);
      TVar20 = 0x1881;
      if (bVar10) {
        bVar10 = FieldDescriptor::is_packed(pFVar18);
        TVar20 = bVar10 + 0x1881;
      }
    }
    else {
      pEVar19 = FieldDescriptor::enum_type(pFVar18);
      bVar10 = anon_unknown_36::GetEnumValidationRange(pEVar19,&first,&last);
      bVar13 = FieldDescriptor::is_repeated(pFVar18);
      if (bVar10) {
        TVar20 = 0x1e81;
        if (bVar13) {
          bVar10 = FieldDescriptor::is_packed(pFVar18);
          TVar20 = bVar10 + 0x1e81;
        }
      }
      else {
        TVar20 = 0x1c81;
        if (bVar13) {
          bVar10 = FieldDescriptor::is_packed(pFVar18);
          TVar20 = bVar10 + 0x1c81;
        }
      }
    }
    break;
  case '\x0f':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x1083;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x1083;
    }
    break;
  case '\x10':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x10c3;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x10c3;
    }
    break;
  case '\x11':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x1281;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x1281;
    }
    break;
  case '\x12':
    bVar10 = FieldDescriptor::is_repeated(pFVar18);
    TVar20 = 0x12c1;
    if (bVar10) {
      bVar10 = FieldDescriptor::is_packed(pFVar18);
      TVar20 = bVar10 + 0x12c1;
    }
    break;
  default:
    goto switchD_00365807_default;
  }
  TVar22 = TVar20 | TVar22;
LAB_00365a9a:
  uVar1 = pFVar18->type_;
switchD_00365807_default:
  if ((uVar1 == '\f') || (uVar1 == '\t')) {
LAB_00365aa9:
    CVar14 = FieldDescriptor::cpp_string_type(pFVar18);
    if ((CVar14 == kView) || (CVar14 == kString)) {
      bVar10 = FieldDescriptor::is_repeated(pFVar18);
      if (bVar10) {
        TVar22 = TVar22 | 0x100;
      }
      else {
        TVar20 = 0;
        if (((FieldOptions *)message_options)->use_micro_string != false) {
          TVar20 = 0x140;
        }
        TVar22 = TVar22 | TVar20;
      }
    }
    else if (CVar14 == kCord) {
      TVar22 = TVar22 | 0x80;
    }
  }
  TVar20 = TVar22 | 8;
  if (((FieldOptions *)message_options)->should_split == false) {
    TVar20 = TVar22;
  }
  pFVar3[-1].type_card = TVar20;
  bVar12 = pFVar18->type_;
  if (bVar12 - 10 < 2) {
    bVar10 = FieldDescriptor::is_map(pFVar18);
    uVar6 = local_80.enum_range.last;
    uVar15 = local_80.offset;
    local_80.offset = (uint32_t)pFVar18;
    uVar5 = local_80.offset;
    local_80.enum_range.last = (int32_t)((ulong)pFVar18 >> 0x20);
    uVar7 = local_80.enum_range.last;
    if (bVar10) {
      pFVar3[-1].aux_idx =
           (uint16_t)
           ((uint)(*(int *)&(local_70->
                            super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                  *(int *)&(local_70->
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 4);
      first = 0xc;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                (local_70,(AuxEntry *)&first);
      if (local_50->field_0x1 == '\x01') {
        pDVar17 = FieldDescriptor::message_type(pFVar18);
        pFVar18 = Descriptor::map_value(pDVar17);
        pDVar17 = FieldDescriptor::message_type(pFVar18);
        uVar6 = local_80.enum_range.last;
        uVar15 = local_80.offset;
        local_80.offset = (uint32_t)pFVar18;
        uVar5 = local_80.offset;
        local_80.enum_range.last = (int32_t)((ulong)pFVar18 >> 0x20);
        uVar7 = local_80.enum_range.last;
        if (pDVar17 == (Descriptor *)0x0) {
          local_80.offset = uVar15;
          local_80.enum_range.last = uVar6;
          if ((pFVar18->type_ == '\x0e') &&
             (bVar10 = cpp::HasPreservingUnknownEnumSemantics(pFVar18), !bVar10)) {
            _first = (FieldDescriptor *)CONCAT44(uStack_84,10);
            local_80.offset = uVar5;
            local_80.enum_range.last = uVar7;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_70,(AuxEntry *)&first);
          }
        }
        else {
          _first = (FieldDescriptor *)CONCAT44(uStack_84,5);
          std::
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                    (local_70,(AuxEntry *)&first);
        }
      }
    }
    else {
      local_80.offset = uVar15;
      local_80.enum_range.last = uVar6;
      if ((pFVar18->options_->field_0)._impl_.weak_ == true) {
        pFVar3[-1].type_card = 0;
      }
      else {
        bVar10 = anon_unknown_36::HasLazyRep(pFVar18,(FieldOptions *)message_options);
        if (bVar10) {
          if (local_50->field_0x1 == '\x01') {
            pFVar3[-1].aux_idx =
                 (uint16_t)
                 ((uint)(*(int *)&(local_70->
                                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(local_70->
                                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
            first = 4;
            local_80.offset = uVar5;
            local_80.enum_range.last = uVar7;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_70,(AuxEntry *)&first);
            if (((FieldOptions *)message_options)->lazy_opt == kTvDefault) {
              _first = (FieldDescriptor *)CONCAT44(uStack_84,7);
              local_80.offset = uVar5;
              local_80.enum_range.last = uVar7;
              std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                        (local_70,(AuxEntry *)&first);
            }
            else {
              _first = (FieldDescriptor *)((ulong)uStack_84 << 0x20);
              local_80.offset = 0;
              local_80.enum_range.last = 0;
              std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                        (local_70,(AuxEntry *)&first);
            }
          }
          else {
            pFVar3[-1].aux_idx = 0xffff;
          }
        }
        else {
          uVar15 = 6;
          if (((((FieldOptions *)message_options)->is_implicitly_weak != false) ||
              (uVar15 = 4, ((FieldOptions *)message_options)->use_direct_tcparser_table != true)) ||
             (uVar15 = 5, ((FieldOptions *)message_options)->presence_probability < 0.005)) {
            pFVar3[-1].aux_idx =
                 (uint16_t)
                 ((uint)(*(int *)&(local_70->
                                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(local_70->
                                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
            _first = (FieldDescriptor *)CONCAT44(uStack_84,uVar15);
            local_80.offset = uVar5;
            local_80.enum_range.last = uVar7;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_70,(AuxEntry *)&first);
          }
          else {
            pAVar4 = (local_70->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pAVar4[local_68].type = kSubTable;
            pAVar4[local_68].field_1.field = pFVar18;
            pFVar3[-1].aux_idx = (uint16_t)local_68;
            local_68 = local_68 + 1;
          }
        }
      }
    }
  }
  else {
    if (bVar12 == 0xe) {
      bVar10 = anon_unknown_36::TreatEnumAsInt(pFVar18);
      pvVar8 = local_70;
      if (!bVar10) {
        pFVar3[-1].aux_idx =
             (uint16_t)
             ((uint)(*(int *)&(local_70->
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(local_70->
                             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4);
        _first = (FieldDescriptor *)((ulong)_first & 0xffffffff00000000);
        local_80.offset = 0;
        local_80.enum_range.last = 0;
        std::
        vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                  (local_70,(AuxEntry *)&first);
        pAVar4 = (pvVar8->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pEVar19 = FieldDescriptor::enum_type(pFVar18);
        bVar10 = anon_unknown_36::GetEnumValidationRange
                           (pEVar19,(int32_t *)&pAVar4[-1].field_1.offset,
                            &pAVar4[-1].field_1.enum_range.last);
        if (bVar10) {
          pAVar4[-1].type = kEnumRange;
        }
        else {
          pAVar4[-1].type = kEnumValidator;
          pAVar4[-1].field_1.field = pFVar18;
        }
        goto LAB_00365ee8;
      }
      bVar12 = pFVar18->type_;
    }
    if (((bVar12 == 0xc) || (bVar12 == 9)) &&
       (((FieldOptions *)message_options)->is_string_inlined == true)) {
      bVar10 = FieldDescriptor::is_repeated(pFVar18);
      pvVar8 = local_70;
      if (bVar10) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&first,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x380,"!field->is_repeated()");
        goto LAB_00365f7a;
      }
      uVar2 = ((FieldOptions *)message_options)->inlined_string_index;
      pFVar3[-1].aux_idx =
           (uint16_t)
           ((uint)(*(int *)&(local_70->
                            super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                  *(int *)&(local_70->
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 4);
      _first = (FieldDescriptor *)CONCAT44(uStack_84,0xb);
      local_80.offset = 0;
      local_80.enum_range.last = 0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::emplace_back<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                (local_70,(AuxEntry *)&first);
      (pvVar8->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].field_1.offset = uVar2;
      pFVar3[-1].inlined_string_idx = uVar2;
    }
  }
LAB_00365ee8:
  message_options = (MessageOptions *)((long)message_options + 0x20);
  local_40 = local_40 + -0x20;
  goto LAB_0036575b;
}

Assistant:

std::vector<TailCallTableInfo::FieldEntryInfo>
TailCallTableInfo::BuildFieldEntries(
    const Descriptor* descriptor, const MessageOptions& message_options,
    absl::Span<const FieldOptions> ordered_fields,
    std::vector<TailCallTableInfo::AuxEntry>& aux_entries) {
  std::vector<FieldEntryInfo> field_entries;
  field_entries.reserve(ordered_fields.size());

  const auto is_non_cold = [](const FieldOptions& options) {
    return options.presence_probability >= 0.005;
  };
  size_t num_non_cold_subtables = 0;
  // We found that clustering non-cold subtables to the top of aux_entries
  // achieves the best load tests results than other strategies (e.g.,
  // clustering all non-cold entries).
  const auto is_non_cold_subtable = [&](const FieldOptions& options) {
    auto* field = options.field;
    // In the following code where we assign kSubTable to aux entries, only
    // the following typed fields are supported.
    return (field->type() == FieldDescriptor::TYPE_MESSAGE ||
            field->type() == FieldDescriptor::TYPE_GROUP) &&
           !field->is_map() && !field->options().weak() &&
           !HasLazyRep(field, options) && !options.is_implicitly_weak &&
           options.use_direct_tcparser_table && is_non_cold(options);
  };
  for (const FieldOptions& options : ordered_fields) {
    if (is_non_cold_subtable(options)) {
      num_non_cold_subtables++;
    }
  }

  size_t subtable_aux_idx_begin = aux_entries.size();
  size_t subtable_aux_idx = aux_entries.size();
  aux_entries.resize(aux_entries.size() + num_non_cold_subtables);

  // Fill in mini table entries.
  for (const auto& options : ordered_fields) {
    auto* field = options.field;
    field_entries.push_back({field, options.has_bit_index});
    auto& entry = field_entries.back();
    entry.utf8_check_mode =
        cpp::GetUtf8CheckMode(field, message_options.is_lite);
    entry.type_card = MakeTypeCardForField(field, entry.hasbit_idx >= 0,
                                           options, entry.utf8_check_mode);

    if (field->type() == FieldDescriptor::TYPE_MESSAGE ||
        field->type() == FieldDescriptor::TYPE_GROUP) {
      // Message-typed fields have a FieldAux with the default instance pointer.
      if (field->is_map()) {
        entry.aux_idx = aux_entries.size();
        aux_entries.push_back({kMapAuxInfo, {field}});
        if (message_options.uses_codegen) {
          // If we don't use codegen we can't add these.
          auto* map_value = field->message_type()->map_value();
          if (map_value->message_type() != nullptr) {
            aux_entries.push_back({kSubTable, {map_value}});
          } else if (map_value->type() == FieldDescriptor::TYPE_ENUM &&
                     !cpp::HasPreservingUnknownEnumSemantics(map_value)) {
            aux_entries.push_back({kEnumValidator, {map_value}});
          }
        }
      } else if (field->options().weak()) {
        // Disable the type card for this entry to force the fallback.
        entry.type_card = 0;
      } else if (HasLazyRep(field, options)) {
        if (message_options.uses_codegen) {
          entry.aux_idx = aux_entries.size();
          aux_entries.push_back({kSubMessage, {field}});
          if (options.lazy_opt == field_layout::kTvEager) {
            aux_entries.push_back({kMessageVerifyFunc, {field}});
          } else {
            aux_entries.push_back({kNothing});
          }
        } else {
          entry.aux_idx = TcParseTableBase::FieldEntry::kNoAuxIdx;
        }
      } else {
        AuxType type = options.is_implicitly_weak          ? kSubMessageWeak
                       : options.use_direct_tcparser_table ? kSubTable
                                                           : kSubMessage;
        if (type == kSubTable && is_non_cold(options)) {
          aux_entries[subtable_aux_idx] = {type, {field}};
          entry.aux_idx = subtable_aux_idx;
          ++subtable_aux_idx;
        } else {
          entry.aux_idx = aux_entries.size();
          aux_entries.push_back({type, {field}});
        }
      }
    } else if (field->type() == FieldDescriptor::TYPE_ENUM &&
               !TreatEnumAsInt(field)) {
      // Enum fields which preserve unknown values (proto3 behavior) are
      // effectively int32 fields with respect to parsing -- i.e., the value
      // does not need to be validated at parse time.
      //
      // Enum fields which do not preserve unknown values (proto2 behavior) use
      // a FieldAux to store validation information. If the enum values are
      // sequential (and within a range we can represent), then the FieldAux
      // entry represents the range using the minimum value (which must fit in
      // an int16_t) and count (a uint16_t). Otherwise, the entry holds a
      // pointer to the generated Name_IsValid function.

      entry.aux_idx = aux_entries.size();
      aux_entries.push_back({});
      auto& aux_entry = aux_entries.back();

      if (GetEnumValidationRange(field->enum_type(), aux_entry.enum_range.first,
                                 aux_entry.enum_range.last)) {
        aux_entry.type = kEnumRange;
      } else {
        aux_entry.type = kEnumValidator;
        aux_entry.field = field;
      }

    } else if ((field->type() == FieldDescriptor::TYPE_STRING ||
                field->type() == FieldDescriptor::TYPE_BYTES) &&
               options.is_string_inlined) {
      ABSL_CHECK(!field->is_repeated());
      // Inlined strings have an extra marker to represent their donation state.
      int idx = options.inlined_string_index;
      // For mini parsing, the donation state index is stored as an `offset`
      // auxiliary entry.
      entry.aux_idx = aux_entries.size();
      aux_entries.push_back({kNumericOffset});
      aux_entries.back().offset = idx;
      // For fast table parsing, the donation state index is stored instead of
      // the aux_idx (this will limit the range to 8 bits).
      entry.inlined_string_idx = idx;
    }
  }
  ABSL_CHECK_EQ(subtable_aux_idx - subtable_aux_idx_begin,
                num_non_cold_subtables);

  return field_entries;
}